

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void time_map_fetch<EasyUseMap<HashObject<16,16>,int>>
               (int iters,vector<int,_std::allocator<int>_> *indices,char *title)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> *in_RSI;
  int in_EDI;
  double ut;
  int i;
  int r;
  Rusage t;
  EasyUseMap<HashObject<16,_16>,_int> set;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  HashObject<16,_16> *in_stack_ffffffffffffff40;
  Rusage *in_stack_ffffffffffffff50;
  _Self local_98 [2];
  key_type *in_stack_ffffffffffffff78;
  _Self in_stack_ffffffffffffff80;
  int local_64;
  uint local_60;
  size_t in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  double in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  
  EasyUseMap<HashObject<16,_16>,_int>::EasyUseMap((EasyUseMap<HashObject<16,_16>,_int> *)0x1debdb);
  Rusage::Rusage((Rusage *)in_stack_ffffffffffffff40);
  for (local_64 = 0; local_64 < in_EDI; local_64 = local_64 + 1) {
    HashObject<16,_16>::HashObject(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    in_stack_ffffffffffffff50 =
         (Rusage *)
         std::
         map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
         ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                       *)in_stack_ffffffffffffff80._M_node,in_stack_ffffffffffffff78);
    *(int *)&(in_stack_ffffffffffffff50->start_).__d.__r = local_64 + 1;
  }
  local_60 = 1;
  Rusage::Reset((Rusage *)in_stack_ffffffffffffff40);
  for (local_64 = 0; local_64 < in_EDI; local_64 = local_64 + 1) {
    std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_64);
    HashObject<16,_16>::HashObject(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    std::
    map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
    ::find((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
            *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),(key_type *)0x1decc2);
    local_98[0]._M_node =
         (_Base_ptr)
         std::
         map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
         ::end((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff80,local_98);
    local_60 = bVar1 ^ local_60;
  }
  Rusage::UserTime(in_stack_ffffffffffffff50);
  srand(local_60);
  report(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
         in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  EasyUseMap<HashObject<16,_16>,_int>::~EasyUseMap((EasyUseMap<HashObject<16,_16>,_int> *)0x1ded68);
  return;
}

Assistant:

static void time_map_fetch(int iters, const vector<int>& indices,
                           char const* title) {
  MapType set;
  Rusage t;
  int r;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  r = 1;
  t.Reset();
  for (i = 0; i < iters; i++) {
    r ^= static_cast<int>(set.find(indices[i]) != set.end());
  }
  double ut = t.UserTime();

  srand(r);  // keep compiler from optimizing away r (we never call rand())
  report(title, ut, iters, 0, 0);
}